

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_detour_impl.c
# Opt level: O0

int funchook_detour_impl_install(detour_impl_handle handle,_func_void **target,_func_void *hook)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  funchook_detour_impl_cast hook_cast;
  funchook_t *handle_impl;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = 1;
  }
  else {
    iVar1 = funchook_prepare(in_RDI,in_RSI,in_RDX);
    if (iVar1 == 0) {
      iVar1 = funchook_install(in_RDI,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int funchook_detour_impl_install(detour_impl_handle handle, void (**target)(void), void (*hook)(void))
{
	funchook_t *handle_impl = handle;

	if (handle_impl != NULL && target != NULL && hook != NULL)
	{
		union funchook_detour_impl_cast hook_cast = { hook };

		if (funchook_prepare(handle_impl, (void **)target, hook_cast.ptr) != FUNCHOOK_ERROR_SUCCESS)
		{
			return 1;
		}

		if (funchook_install(handle_impl, 0) != FUNCHOOK_ERROR_SUCCESS)
		{
			return 1;
		}

		return 0;
	}

	return 1;
}